

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.h
# Opt level: O0

void __thiscall CompressedHeader::CompressedHeader(CompressedHeader *this,CBlockHeader *header)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  uint256 *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = 0;
  uint256::uint256(in_stack_ffffffffffffffd8);
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  *in_RDI = *in_RSI;
  uVar2 = in_RSI[9];
  uVar3 = in_RSI[10];
  uVar4 = in_RSI[0xb];
  uVar5 = in_RSI[0xc];
  uVar6 = in_RSI[0xe];
  uVar7 = in_RSI[0xf];
  uVar8 = in_RSI[0x10];
  in_RDI[5] = in_RSI[0xd];
  in_RDI[6] = uVar6;
  in_RDI[7] = uVar7;
  in_RDI[8] = uVar8;
  in_RDI[1] = uVar2;
  in_RDI[2] = uVar3;
  in_RDI[3] = uVar4;
  in_RDI[4] = uVar5;
  in_RDI[9] = in_RSI[0x11];
  in_RDI[10] = in_RSI[0x12];
  in_RDI[0xb] = in_RSI[0x13];
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CompressedHeader(const CBlockHeader& header)
    {
        nVersion = header.nVersion;
        hashMerkleRoot = header.hashMerkleRoot;
        nTime = header.nTime;
        nBits = header.nBits;
        nNonce = header.nNonce;
    }